

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O3

PointSet * __thiscall
hnsw::HNSWIndex::Search(PointSet *__return_storage_ptr__,HNSWIndex *this,uint32_t K,float *query)

{
  bool bVar1;
  uint uVar2;
  Point ep;
  MaxHeap candidates;
  Point local_58;
  MaxHeap local_50;
  
  (**this->distance_->_vptr_Distance)
            (this->distance_,query,
             (this->points_).row_ptrs_.
             super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
             super__Vector_impl_data._M_start[this->ep_]);
  local_58.first = this->ep_;
  uVar2 = this->top_layer_;
  if (0 < (int)uVar2) {
    do {
      SearchUpperLayer(this,query,&local_58,uVar2);
      bVar1 = 1 < uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  uVar2 = this->ef_search_;
  if (this->ef_search_ <= K) {
    uVar2 = K;
  }
  SearchLayer(&local_50,this,query,&local_58,uVar2,0);
  SelectNeighbors(__return_storage_ptr__,this,query,&local_50,K);
  if (local_50.super_MaxHeapImpl.c.
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super_MaxHeapImpl.c.
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

PointSet Search(uint32_t K, const float *query) {
    Point ep(ep_, distance_(query, points_[ep_]));
    for (layer_t l = top_layer_; l > 0; l--) {
      SearchUpperLayer(query, ep, l);
    }

    uint32_t ef_search = std::max(ef_search_, K);
    MaxHeap candidates = SearchLayer(query, ep, ef_search, 0);
    PointSet result = SelectNeighbors(query, candidates, K);

    return result;
  }